

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall
Variable_addAndGetEquivalentVariableReciprocal_Test::TestBody
          (Variable_addAndGetEquivalentVariableReciprocal_Test *this)

{
  char *pcVar1;
  AssertHelper aAStack_58 [8];
  shared_ptr<libcellml::Variable> local_50;
  AssertionResult gtest_ar;
  VariablePtr v2;
  VariablePtr v1;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence((shared_ptr *)&v1,(shared_ptr *)&v2);
  libcellml::Variable::equivalentVariable((ulong)&local_50);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&gtest_ar,"v1","v2->equivalentVariable(0)",&v1,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x3c,pcVar1);
    testing::internal::AssertHelper::operator=(aAStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(aAStack_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, addAndGetEquivalentVariableReciprocal)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    EXPECT_EQ(v1, v2->equivalentVariable(0));
}